

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

int __thiscall Frame::remove(Frame *this,char *__filename)

{
  uchar **ppuVar1;
  pointer local_28;
  uint8_t *local_20;
  char *local_18;
  size_t numBytes_local;
  Frame *this_local;
  
  local_20 = this->m_Pos + (long)__filename;
  local_18 = __filename;
  numBytes_local = (size_t)this;
  local_28 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->m_Data);
  local_28 = local_28 + this->m_Size;
  ppuVar1 = std::min<unsigned_char*>(&local_20,&local_28);
  this->m_Pos = *ppuVar1;
  return (int)this;
}

Assistant:

Frame& Frame::remove(size_t numBytes)
{
    m_Pos = std::min<uint8_t*>(m_Pos + numBytes, m_Data.get() + m_Size);
    return *this;
}